

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderTestUtil.cpp
# Opt level: O2

char * vkt::SpirVAssembly::getComputeAsmInputOutputBufferTraits(void)

{
  return 
  "OpDecorate %buf BufferBlock\nOpDecorate %indata DescriptorSet 0\nOpDecorate %indata Binding 0\nOpDecorate %outdata DescriptorSet 0\nOpDecorate %outdata Binding 1\nOpDecorate %f32arr ArrayStride 4\nOpMemberDecorate %buf 0 Offset 0\n"
  ;
}

Assistant:

const char* getComputeAsmInputOutputBufferTraits (void)
{
	return
		"OpDecorate %buf BufferBlock\n"
		"OpDecorate %indata DescriptorSet 0\n"
		"OpDecorate %indata Binding 0\n"
		"OpDecorate %outdata DescriptorSet 0\n"
		"OpDecorate %outdata Binding 1\n"
		"OpDecorate %f32arr ArrayStride 4\n"
		"OpMemberDecorate %buf 0 Offset 0\n";
}